

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  uint uVar2;
  const_iterator cVar3;
  runtime_error *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)flags->lower;
  if ((uVar2 >> 0xe & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    uVar2 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar2 < 300) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this_00,"noperspective requires ESSL 300.");
        goto LAB_002ba8fe;
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_NV_shader_noperspective_interpolation","");
      require_extension_internal(this,&local_48);
LAB_002ba5ef:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    else if (uVar2 < 0x82) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_EXT_gpu_shader4","")
      ;
      require_extension_internal(this,&local_48);
      goto LAB_002ba5ef;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((short)uVar2 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    if ((this->options).es == true) {
      uVar2 = (this->options).version;
      if (uVar2 < 300) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this_00,"sample requires ESSL 300.");
        goto LAB_002ba8fe;
      }
      if (uVar2 < 0x140) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_OES_shader_multisample_interpolation","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if (((uVar2 >> 0x12 & 1) != 0) &&
     (((this->options).es != false || (0x77 < (this->options).version)))) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_48._M_dataplus._M_p._0_4_ = 0x1497;
  this_01 = &flags->higher;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_01->_M_h,(key_type *)&local_48);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_EXT_mesh_shader","");
    require_extension_internal(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  local_48._M_dataplus._M_p._0_4_ = 4999;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_01->_M_h,(key_type *)&local_48);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"GL_AMD_shader_explicit_vertex_parameter","");
    require_extension_internal(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_48._M_dataplus._M_p._0_4_ = 0x14a5;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_01->_M_h,(key_type *)&local_48);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    return __return_storage_ptr__;
  }
  bVar1 = (this->options).es;
  uVar2 = (this->options).version;
  if ((uVar2 < 0x140 & bVar1) == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"pervertexEXT requires ESSL 320.");
  }
  else {
    if (bVar1 != false || 0x1c1 < uVar2) {
      if (this->barycentric_is_nv == true) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_NV_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_EXT_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"pervertexEXT requires GLSL 450.");
  }
LAB_002ba8fe:
  *(undefined ***)this_00 = &PTR__runtime_error_0048ff00;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("noperspective requires ESSL 300.");
			require_extension_internal("GL_NV_shader_noperspective_interpolation");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_EXT_gpu_shader4");
		res += "noperspective ";
	}
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("sample requires ESSL 300.");
			else if (options.version < 320)
				require_extension_internal("GL_OES_shader_multisample_interpolation");
		}
		res += "sample ";
	}
	if (flags.get(DecorationInvariant) && (options.es || options.version >= 120))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	{
		res += "perprimitiveEXT ";
		require_extension_internal("GL_EXT_mesh_shader");
	}

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}